

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::set(EntryImpl *this,Own<const_kj::File> *value)

{
  Own<const_kj::File> *other;
  Own<const_kj::File> local_28;
  Own<const_kj::File> *local_18;
  Own<const_kj::File> *value_local;
  EntryImpl *this_local;
  
  local_18 = value;
  value_local = (Own<const_kj::File> *)this;
  other = mv<kj::Own<kj::File_const>>(value);
  Own<const_kj::File>::Own(&local_28,other);
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  ::
  init<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
            ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              *)&this->node,(FileNode *)&local_28);
  FileNode::~FileNode((FileNode *)&local_28);
  return;
}

Assistant:

void set(Own<const File>&& value) {
      node.init<FileNode>(FileNode { kj::mv(value) });
    }